

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O0

void gdImageGifAnimBeginCtx(gdImagePtr im,gdIOCtxPtr out,int GlobalCM,int Loops)

{
  int w;
  byte bVar1;
  int iVar2;
  byte bVar3;
  int local_40;
  int i;
  int Background;
  int BitsPerPixel;
  int ColorMapSize;
  int Resolution;
  int RHeight;
  int RWidth;
  int B;
  int Loops_local;
  int GlobalCM_local;
  gdIOCtxPtr out_local;
  gdImagePtr im_local;
  
  B = GlobalCM;
  if (GlobalCM < 0) {
    B = 1;
  }
  iVar2 = colorstobpp(im->colorsTotal);
  bVar3 = (byte)iVar2;
  iVar2 = im->sx;
  w = im->sy;
  gdPutBuf("GIF89a",6,out);
  gifPutWord(iVar2,out);
  gifPutWord(w,out);
  bVar1 = 0;
  if (B != 0) {
    bVar1 = 0x80;
  }
  gdPutC(bVar3 - 1 | (bVar3 - 1) * '\x10' | bVar1,out);
  gdPutC('\0',out);
  gdPutC('\0',out);
  if (B != 0) {
    for (local_40 = 0; local_40 < 1 << (bVar3 & 0x1f); local_40 = local_40 + 1) {
      gdPutC((uchar)im->red[local_40],out);
      gdPutC((uchar)im->green[local_40],out);
      gdPutC((uchar)im->blue[local_40],out);
    }
  }
  if (-1 < Loops) {
    gdPutBuf(anon_var_dwarf_a5b8,0x10,out);
    gifPutWord(Loops,out);
    gdPutC('\0',out);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimBeginCtx(gdImagePtr im, gdIOCtxPtr out, int GlobalCM, int Loops)
{
	int B;
	int RWidth, RHeight;
	int Resolution;
	int ColorMapSize;
	int BitsPerPixel;
	int Background = 0;
	int i;

	/* Default is to use global color map */
	if (GlobalCM < 0) {
		GlobalCM = 1;
	}

	BitsPerPixel = colorstobpp(im->colorsTotal);
	ColorMapSize = 1 << BitsPerPixel;

	RWidth = im->sx;
	RHeight = im->sy;

	Resolution = BitsPerPixel;

	/* Write the Magic header */
	gdPutBuf("GIF89a", 6, out);

	/* Write out the screen width and height */
	gifPutWord(RWidth, out);
	gifPutWord(RHeight, out);

	/* Indicate that there is a global colour map */
	B = GlobalCM ? 0x80 : 0;

	/* OR in the resolution */
	B |= (Resolution - 1) << 4;

	/* OR in the Bits per Pixel */
	B |= (BitsPerPixel - 1);

	/* Write it out */
	gdPutC(B, out);

	/* Write out the Background colour */
	gdPutC(Background, out);

	/* Byte of 0's (future expansion) */
	gdPutC(0, out);

	/* Write out the Global Colour Map */
	if(GlobalCM) {
		for(i = 0; i < ColorMapSize; ++i) {
			gdPutC(im->red[i], out);
			gdPutC(im->green[i], out);
			gdPutC(im->blue[i], out);
		}
	}

	if(Loops >= 0) {
		gdPutBuf("!\377\13NETSCAPE2.0\3\1", 16, out);
		gifPutWord(Loops, out);
		gdPutC(0, out);
	}
}